

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O1

void __thiscall
server::ctfservmode::initclient(ctfservmode *this,clientinfo *ci,packetbuf *p,bool connecting)

{
  int n;
  flag *pfVar1;
  int iVar2;
  long lVar3;
  int k;
  long lVar4;
  
  putint(p,0x56);
  lVar4 = 0;
  do {
    putint(p,this->scores[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  putint(p,(this->flags).ulen);
  if (0 < (this->flags).ulen) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pfVar1 = (this->flags).buf;
      putint(p,*(int *)((long)&pfVar1->version + lVar3));
      putint(p,*(int *)((long)&pfVar1->spawnindex + lVar3));
      putint(p,*(int *)((long)&pfVar1->owner + lVar3));
      putint(p,(uint)(*(int *)((long)&pfVar1->invistime + lVar3) != 0));
      if (*(int *)((long)&pfVar1->owner + lVar3) < 0) {
        putint(p,(uint)(*(int *)((long)&pfVar1->droptime + lVar3) != 0));
        if (*(int *)((long)&pfVar1->droptime + lVar3) != 0) {
          putint(p,(int)(*(float *)((long)&(pfVar1->droploc).field_0 + lVar3) * 16.0));
          putint(p,(int)(*(float *)((long)&(pfVar1->droploc).field_0 + lVar3 + 4) * 16.0));
          putint(p,(int)(*(float *)((long)&(pfVar1->droploc).field_0 + lVar3 + 8) * 16.0));
        }
      }
      if ((gamemode + 3U < 0x1a) && ((0x4c0000UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) {
        n = *(int *)((long)&pfVar1->team + lVar3);
        iVar2 = -1;
        if ((n != 0) && (*(int *)((long)&pfVar1->holdtime + lVar3) != 0)) {
          putint(p,n);
          iVar2 = flag::holdcounter((flag *)((long)&pfVar1->id + lVar3));
          iVar2 = iVar2 / 100;
        }
        putint(p,iVar2);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x44;
    } while (lVar4 < (this->flags).ulen);
  }
  return;
}

Assistant:

void initclient(clientinfo *ci, packetbuf &p, bool connecting)
    {
        putint(p, N_INITFLAGS);
        loopk(2) putint(p, scores[k]);
        putint(p, flags.length());
        loopv(flags)
        {
            flag &f = flags[i];
            putint(p, f.version);
            putint(p, f.spawnindex);
            putint(p, f.owner);
            putint(p, f.invistime ? 1 : 0);
            if(f.owner<0)
            {
                putint(p, f.droptime ? 1 : 0);
                if(f.droptime)
                {
                    putint(p, int(f.droploc.x*DMF));
                    putint(p, int(f.droploc.y*DMF));
                    putint(p, int(f.droploc.z*DMF));
                }
            }
            if(m_hold)
            {
                if(!f.team || !f.holdtime) putint(p, -1);
                else
                {
                    putint(p, f.team);
                    putint(p, f.holdcounter() / 100);
                }
            }
        }
    }